

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_sad_intrin_ssse3.c
# Opt level: O0

uint aom_masked_sad8xh_ssse3
               (uint8_t *src_ptr,int src_stride,uint8_t *a_ptr,int a_stride,uint8_t *b_ptr,
               int b_stride,uint8_t *m_ptr,int m_stride,int height)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int in_ECX;
  undefined8 *in_RDX;
  int iVar14;
  longlong in_RSI;
  undefined8 *in_RDI;
  undefined8 *in_R8;
  int in_R9D;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar15 [16];
  __m128i v_val_w;
  __m128i alVar16;
  undefined8 *in_stack_00000008;
  uint sad;
  __m128i pred;
  __m128i pred_r;
  __m128i mask_r;
  __m128i data_r;
  __m128i pred_l;
  __m128i mask_l;
  __m128i data_l;
  __m128i m_inv;
  __m128i m;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i src;
  __m128i mask_max;
  __m128i res;
  int y;
  undefined4 local_348;
  undefined4 uStack_340;
  undefined4 local_338;
  undefined8 local_330;
  undefined8 local_320;
  undefined8 local_310;
  undefined1 local_1a8;
  undefined1 uStack_1a7;
  undefined1 uStack_1a6;
  undefined1 uStack_1a5;
  undefined1 uStack_1a4;
  undefined1 uStack_1a3;
  undefined1 uStack_1a2;
  undefined1 uStack_1a1;
  undefined1 uStack_1a0;
  undefined1 uStack_19f;
  undefined1 uStack_19e;
  undefined1 uStack_19d;
  undefined1 uStack_19c;
  undefined1 uStack_19b;
  undefined1 uStack_19a;
  undefined1 uStack_199;
  undefined1 local_188;
  undefined1 uStack_187;
  undefined1 uStack_186;
  undefined1 uStack_185;
  undefined1 uStack_184;
  undefined1 uStack_183;
  undefined1 uStack_182;
  undefined1 uStack_181;
  undefined1 local_178;
  undefined1 uStack_177;
  undefined1 uStack_176;
  undefined1 uStack_175;
  undefined1 uStack_174;
  undefined1 uStack_173;
  undefined1 uStack_172;
  undefined1 uStack_171;
  undefined1 local_148;
  undefined1 uStack_147;
  undefined1 uStack_146;
  undefined1 uStack_145;
  undefined1 uStack_144;
  undefined1 uStack_143;
  undefined1 uStack_142;
  undefined1 uStack_141;
  undefined1 local_138;
  undefined1 uStack_137;
  undefined1 uStack_136;
  undefined1 uStack_135;
  undefined1 uStack_134;
  undefined1 uStack_133;
  undefined1 uStack_132;
  undefined1 uStack_131;
  undefined2 local_c8;
  undefined2 uStack_c6;
  undefined2 uStack_c4;
  undefined2 uStack_c2;
  undefined2 uStack_c0;
  undefined2 uStack_be;
  undefined2 uStack_bc;
  undefined2 uStack_ba;
  undefined2 local_b8;
  undefined2 uStack_b6;
  undefined2 uStack_b4;
  undefined2 uStack_b2;
  undefined2 uStack_b0;
  undefined2 uStack_ae;
  undefined2 uStack_ac;
  undefined2 uStack_aa;
  undefined4 local_a8;
  undefined4 uStack_a0;
  
  iVar14 = (int)in_RSI;
  local_348 = 0;
  uStack_340 = 0;
  local_330 = in_R8;
  local_320 = in_RDX;
  local_310 = in_RDI;
  for (local_338 = 0; local_338 < (int)pred[1]; local_338 = local_338 + 2) {
    uVar1 = *local_310;
    uVar2 = *(undefined8 *)((long)local_310 + (long)iVar14);
    uVar3 = *local_320;
    uVar4 = *(undefined8 *)((long)local_320 + (long)in_ECX);
    uVar5 = *local_330;
    uVar6 = *(undefined8 *)((long)local_330 + (long)in_R9D);
    uVar7 = *in_stack_00000008;
    uVar8 = *(undefined8 *)((long)in_stack_00000008 + (long)(int)pred[0]);
    local_1a8 = (char)uVar7;
    uStack_1a7 = (char)((ulong)uVar7 >> 8);
    uStack_1a6 = (char)((ulong)uVar7 >> 0x10);
    uStack_1a5 = (char)((ulong)uVar7 >> 0x18);
    uStack_1a4 = (char)((ulong)uVar7 >> 0x20);
    uStack_1a3 = (char)((ulong)uVar7 >> 0x28);
    uStack_1a2 = (char)((ulong)uVar7 >> 0x30);
    uStack_1a1 = (char)((ulong)uVar7 >> 0x38);
    uStack_1a0 = (char)uVar8;
    uStack_19f = (char)((ulong)uVar8 >> 8);
    uStack_19e = (char)((ulong)uVar8 >> 0x10);
    uStack_19d = (char)((ulong)uVar8 >> 0x18);
    uStack_19c = (char)((ulong)uVar8 >> 0x20);
    uStack_19b = (char)((ulong)uVar8 >> 0x28);
    uStack_19a = (char)((ulong)uVar8 >> 0x30);
    uStack_199 = (char)((ulong)uVar8 >> 0x38);
    local_138 = (undefined1)uVar3;
    uStack_137 = (undefined1)((ulong)uVar3 >> 8);
    uStack_136 = (undefined1)((ulong)uVar3 >> 0x10);
    uStack_135 = (undefined1)((ulong)uVar3 >> 0x18);
    uStack_134 = (undefined1)((ulong)uVar3 >> 0x20);
    uStack_133 = (undefined1)((ulong)uVar3 >> 0x28);
    uStack_132 = (undefined1)((ulong)uVar3 >> 0x30);
    uStack_131 = (undefined1)((ulong)uVar3 >> 0x38);
    local_148 = (undefined1)uVar5;
    uStack_147 = (undefined1)((ulong)uVar5 >> 8);
    uStack_146 = (undefined1)((ulong)uVar5 >> 0x10);
    uStack_145 = (undefined1)((ulong)uVar5 >> 0x18);
    uStack_144 = (undefined1)((ulong)uVar5 >> 0x20);
    uStack_143 = (undefined1)((ulong)uVar5 >> 0x28);
    uStack_142 = (undefined1)((ulong)uVar5 >> 0x30);
    uStack_141 = (undefined1)((ulong)uVar5 >> 0x38);
    auVar11[1] = local_148;
    auVar11[0] = local_138;
    auVar11[2] = uStack_137;
    auVar11[3] = uStack_147;
    auVar11[4] = uStack_136;
    auVar11[5] = uStack_146;
    auVar11[6] = uStack_135;
    auVar11[7] = uStack_145;
    auVar11[9] = uStack_144;
    auVar11[8] = uStack_134;
    auVar11[10] = uStack_133;
    auVar11[0xb] = uStack_143;
    auVar11[0xc] = uStack_132;
    auVar11[0xd] = uStack_142;
    auVar11[0xe] = uStack_131;
    auVar11[0xf] = uStack_141;
    auVar10[1] = '@' - local_1a8;
    auVar10[0] = local_1a8;
    auVar10[2] = uStack_1a7;
    auVar10[3] = '@' - uStack_1a7;
    auVar10[4] = uStack_1a6;
    auVar10[5] = '@' - uStack_1a6;
    auVar10[6] = uStack_1a5;
    auVar10[7] = '@' - uStack_1a5;
    auVar10[9] = '@' - uStack_1a4;
    auVar10[8] = uStack_1a4;
    auVar10[10] = uStack_1a3;
    auVar10[0xb] = '@' - uStack_1a3;
    auVar10[0xc] = uStack_1a2;
    auVar10[0xd] = '@' - uStack_1a2;
    auVar10[0xe] = uStack_1a1;
    auVar10[0xf] = '@' - uStack_1a1;
    pmaddubsw(auVar11,auVar10);
    alVar16[1] = in_RSI;
    alVar16[0] = 6;
    alVar16 = xx_roundn_epu16(alVar16,(int)in_RDX);
    local_178 = (undefined1)uVar4;
    uStack_177 = (undefined1)((ulong)uVar4 >> 8);
    uStack_176 = (undefined1)((ulong)uVar4 >> 0x10);
    uStack_175 = (undefined1)((ulong)uVar4 >> 0x18);
    uStack_174 = (undefined1)((ulong)uVar4 >> 0x20);
    uStack_173 = (undefined1)((ulong)uVar4 >> 0x28);
    uStack_172 = (undefined1)((ulong)uVar4 >> 0x30);
    uStack_171 = (undefined1)((ulong)uVar4 >> 0x38);
    local_188 = (undefined1)uVar6;
    uStack_187 = (undefined1)((ulong)uVar6 >> 8);
    uStack_186 = (undefined1)((ulong)uVar6 >> 0x10);
    uStack_185 = (undefined1)((ulong)uVar6 >> 0x18);
    uStack_184 = (undefined1)((ulong)uVar6 >> 0x20);
    uStack_183 = (undefined1)((ulong)uVar6 >> 0x28);
    uStack_182 = (undefined1)((ulong)uVar6 >> 0x30);
    uStack_181 = (undefined1)((ulong)uVar6 >> 0x38);
    auVar9[1] = local_188;
    auVar9[0] = local_178;
    auVar9[2] = uStack_177;
    auVar9[3] = uStack_187;
    auVar9[4] = uStack_176;
    auVar9[5] = uStack_186;
    auVar9[6] = uStack_175;
    auVar9[7] = uStack_185;
    auVar9[9] = uStack_184;
    auVar9[8] = uStack_174;
    auVar9[10] = uStack_173;
    auVar9[0xb] = uStack_183;
    auVar9[0xc] = uStack_172;
    auVar9[0xd] = uStack_182;
    auVar9[0xe] = uStack_171;
    auVar9[0xf] = uStack_181;
    auVar15[1] = '@' - uStack_1a0;
    auVar15[0] = uStack_1a0;
    auVar15[2] = uStack_19f;
    auVar15[3] = '@' - uStack_19f;
    auVar15[4] = uStack_19e;
    auVar15[5] = '@' - uStack_19e;
    auVar15[6] = uStack_19d;
    auVar15[7] = '@' - uStack_19d;
    auVar15[9] = '@' - uStack_19c;
    auVar15[8] = uStack_19c;
    auVar15[10] = uStack_19b;
    auVar15[0xb] = '@' - uStack_19b;
    auVar15[0xc] = uStack_19a;
    auVar15[0xd] = '@' - uStack_19a;
    auVar15[0xe] = uStack_199;
    auVar15[0xf] = '@' - uStack_199;
    pmaddubsw(auVar9,auVar15);
    v_val_w[1] = in_RSI;
    v_val_w[0] = 6;
    alVar16 = xx_roundn_epu16(v_val_w,(int)alVar16[1]);
    in_RDX = alVar16[1];
    local_b8 = (short)extraout_XMM0_Qa;
    uStack_b6 = (short)((ulong)extraout_XMM0_Qa >> 0x10);
    uStack_b4 = (short)((ulong)extraout_XMM0_Qa >> 0x20);
    uStack_b2 = (short)((ulong)extraout_XMM0_Qa >> 0x30);
    uStack_b0 = (short)extraout_XMM0_Qb;
    uStack_ae = (short)((ulong)extraout_XMM0_Qb >> 0x10);
    uStack_ac = (short)((ulong)extraout_XMM0_Qb >> 0x20);
    uStack_aa = (short)((ulong)extraout_XMM0_Qb >> 0x30);
    local_c8 = (short)extraout_XMM0_Qa_00;
    uStack_c6 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x10);
    uStack_c4 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x20);
    uStack_c2 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x30);
    uStack_c0 = (short)extraout_XMM0_Qb_00;
    uStack_be = (short)((ulong)extraout_XMM0_Qb_00 >> 0x10);
    uStack_bc = (short)((ulong)extraout_XMM0_Qb_00 >> 0x20);
    uStack_ba = (short)((ulong)extraout_XMM0_Qb_00 >> 0x30);
    auVar13[1] = (0 < uStack_b6) * (uStack_b6 < 0x100) * (char)((ulong)extraout_XMM0_Qa >> 0x10) -
                 (0xff < uStack_b6);
    auVar13[0] = (0 < local_b8) * (local_b8 < 0x100) * (char)extraout_XMM0_Qa - (0xff < local_b8);
    auVar13[2] = (0 < uStack_b4) * (uStack_b4 < 0x100) * (char)((ulong)extraout_XMM0_Qa >> 0x20) -
                 (0xff < uStack_b4);
    auVar13[3] = (0 < uStack_b2) * (uStack_b2 < 0x100) * (char)((ulong)extraout_XMM0_Qa >> 0x30) -
                 (0xff < uStack_b2);
    auVar13[4] = (0 < uStack_b0) * (uStack_b0 < 0x100) * (char)extraout_XMM0_Qb - (0xff < uStack_b0)
    ;
    auVar13[5] = (0 < uStack_ae) * (uStack_ae < 0x100) * (char)((ulong)extraout_XMM0_Qb >> 0x10) -
                 (0xff < uStack_ae);
    auVar13[6] = (0 < uStack_ac) * (uStack_ac < 0x100) * (char)((ulong)extraout_XMM0_Qb >> 0x20) -
                 (0xff < uStack_ac);
    auVar13[7] = (0 < uStack_aa) * (uStack_aa < 0x100) * (char)((ulong)extraout_XMM0_Qb >> 0x30) -
                 (0xff < uStack_aa);
    auVar13[9] = (0 < uStack_c6) * (uStack_c6 < 0x100) * (char)((ulong)extraout_XMM0_Qa_00 >> 0x10)
                 - (0xff < uStack_c6);
    auVar13[8] = (0 < local_c8) * (local_c8 < 0x100) * (char)extraout_XMM0_Qa_00 - (0xff < local_c8)
    ;
    auVar13[10] = (0 < uStack_c4) * (uStack_c4 < 0x100) * (char)((ulong)extraout_XMM0_Qa_00 >> 0x20)
                  - (0xff < uStack_c4);
    auVar13[0xb] = (0 < uStack_c2) * (uStack_c2 < 0x100) *
                   (char)((ulong)extraout_XMM0_Qa_00 >> 0x30) - (0xff < uStack_c2);
    auVar13[0xc] = (0 < uStack_c0) * (uStack_c0 < 0x100) * (char)extraout_XMM0_Qb_00 -
                   (0xff < uStack_c0);
    auVar13[0xd] = (0 < uStack_be) * (uStack_be < 0x100) *
                   (char)((ulong)extraout_XMM0_Qb_00 >> 0x10) - (0xff < uStack_be);
    auVar13[0xe] = (0 < uStack_bc) * (uStack_bc < 0x100) *
                   (char)((ulong)extraout_XMM0_Qb_00 >> 0x20) - (0xff < uStack_bc);
    auVar13[0xf] = (0 < uStack_ba) * (uStack_ba < 0x100) *
                   (char)((ulong)extraout_XMM0_Qb_00 >> 0x30) - (0xff < uStack_ba);
    auVar12._8_8_ = uVar2;
    auVar12._0_8_ = uVar1;
    auVar15 = psadbw(auVar13,auVar12);
    local_a8 = auVar15._0_4_;
    uStack_a0 = auVar15._8_4_;
    local_348 = local_348 + local_a8;
    uStack_340 = uStack_340 + uStack_a0;
    local_310 = (undefined8 *)((long)local_310 + (long)(iVar14 << 1));
    local_320 = (undefined8 *)((long)local_320 + (long)(in_ECX << 1));
    local_330 = (undefined8 *)((long)local_330 + (long)(in_R9D << 1));
    in_stack_00000008 = (undefined8 *)((long)in_stack_00000008 + (long)((int)pred[0] << 1));
  }
  return local_348 + uStack_340;
}

Assistant:

unsigned int aom_masked_sad8xh_ssse3(const uint8_t *src_ptr, int src_stride,
                                     const uint8_t *a_ptr, int a_stride,
                                     const uint8_t *b_ptr, int b_stride,
                                     const uint8_t *m_ptr, int m_stride,
                                     int height) {
  int y;
  __m128i res = _mm_setzero_si128();
  const __m128i mask_max = _mm_set1_epi8((1 << AOM_BLEND_A64_ROUND_BITS));

  for (y = 0; y < height; y += 2) {
    const __m128i src = _mm_unpacklo_epi64(
        _mm_loadl_epi64((const __m128i *)src_ptr),
        _mm_loadl_epi64((const __m128i *)&src_ptr[src_stride]));
    const __m128i a0 = _mm_loadl_epi64((const __m128i *)a_ptr);
    const __m128i a1 = _mm_loadl_epi64((const __m128i *)&a_ptr[a_stride]);
    const __m128i b0 = _mm_loadl_epi64((const __m128i *)b_ptr);
    const __m128i b1 = _mm_loadl_epi64((const __m128i *)&b_ptr[b_stride]);
    const __m128i m =
        _mm_unpacklo_epi64(_mm_loadl_epi64((const __m128i *)m_ptr),
                           _mm_loadl_epi64((const __m128i *)&m_ptr[m_stride]));
    const __m128i m_inv = _mm_sub_epi8(mask_max, m);

    const __m128i data_l = _mm_unpacklo_epi8(a0, b0);
    const __m128i mask_l = _mm_unpacklo_epi8(m, m_inv);
    __m128i pred_l = _mm_maddubs_epi16(data_l, mask_l);
    pred_l = xx_roundn_epu16(pred_l, AOM_BLEND_A64_ROUND_BITS);

    const __m128i data_r = _mm_unpacklo_epi8(a1, b1);
    const __m128i mask_r = _mm_unpackhi_epi8(m, m_inv);
    __m128i pred_r = _mm_maddubs_epi16(data_r, mask_r);
    pred_r = xx_roundn_epu16(pred_r, AOM_BLEND_A64_ROUND_BITS);

    const __m128i pred = _mm_packus_epi16(pred_l, pred_r);
    res = _mm_add_epi32(res, _mm_sad_epu8(pred, src));

    src_ptr += src_stride * 2;
    a_ptr += a_stride * 2;
    b_ptr += b_stride * 2;
    m_ptr += m_stride * 2;
  }
  unsigned int sad = (unsigned int)(_mm_cvtsi128_si32(res) +
                                    _mm_cvtsi128_si32(_mm_srli_si128(res, 8)));
  return sad;
}